

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall spirv_cross::ParsedIR::mark_used_as_array_length(ParsedIR *this,ID id)

{
  uint32_t uVar1;
  Types TVar2;
  Variant *this_00;
  SPIRConstant *pSVar3;
  uint *puVar4;
  ID local_50;
  uint32_t local_4c;
  uint *puStack_48;
  uint32_t arg_id;
  uint *__end5;
  uint *__begin5;
  SmallVector<unsigned_int,_8UL> *__range5;
  ID local_28;
  ID local_24;
  SPIRConstantOp *local_20;
  SPIRConstantOp *cop;
  ParsedIR *this_local;
  ID id_local;
  
  cop = (SPIRConstantOp *)this;
  this_local._4_4_ = id.id;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uVar1);
  TVar2 = Variant::get_type(this_00);
  if (TVar2 == TypeConstant) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    pSVar3 = get<spirv_cross::SPIRConstant>(this,uVar1);
    pSVar3->is_used_as_array_length = true;
  }
  else if (TVar2 == TypeConstantOp) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    local_20 = get<spirv_cross::SPIRConstantOp>(this,uVar1);
    if (*(int *)&(local_20->super_IVariant).field_0xc == 0x51) {
      puVar4 = VectorView<unsigned_int>::operator[]
                         (&(local_20->arguments).super_VectorView<unsigned_int>,0);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_24,*puVar4);
      mark_used_as_array_length(this,local_24);
    }
    else if (*(int *)&(local_20->super_IVariant).field_0xc == 0x52) {
      puVar4 = VectorView<unsigned_int>::operator[]
                         (&(local_20->arguments).super_VectorView<unsigned_int>,0);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_28,*puVar4);
      mark_used_as_array_length(this,local_28);
      puVar4 = VectorView<unsigned_int>::operator[]
                         (&(local_20->arguments).super_VectorView<unsigned_int>,1);
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)((long)&__range5 + 4),*puVar4);
      mark_used_as_array_length(this,__range5._4_4_);
    }
    else {
      __begin5 = (uint *)&local_20->arguments;
      __end5 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin5);
      puStack_48 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin5);
      for (; __end5 != puStack_48; __end5 = __end5 + 1) {
        local_4c = *__end5;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_50,local_4c);
        mark_used_as_array_length(this,local_50);
      }
    }
  }
  else if (TVar2 != TypeUndef) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x20d,"void spirv_cross::ParsedIR::mark_used_as_array_length(ID)");
  }
  return;
}

Assistant:

void ParsedIR::mark_used_as_array_length(ID id)
{
	switch (ids[id].get_type())
	{
	case TypeConstant:
		get<SPIRConstant>(id).is_used_as_array_length = true;
		break;

	case TypeConstantOp:
	{
		auto &cop = get<SPIRConstantOp>(id);
		if (cop.opcode == OpCompositeExtract)
			mark_used_as_array_length(cop.arguments[0]);
		else if (cop.opcode == OpCompositeInsert)
		{
			mark_used_as_array_length(cop.arguments[0]);
			mark_used_as_array_length(cop.arguments[1]);
		}
		else
			for (uint32_t arg_id : cop.arguments)
				mark_used_as_array_length(arg_id);
		break;
	}

	case TypeUndef:
		break;

	default:
		assert(0);
	}
}